

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

ON_Curve * __thiscall ON_PolyCurve::ExplodeSingleSegmentCurve(ON_PolyCurve *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_Object *this_00;
  
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count == 1) {
    iVar2 = (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
              super_ON_Object._vptr_ON_Object[0x24])();
    this_00 = (ON_Object *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (ON_Object *)0x0) {
      bVar1 = ON_Object::IsKindOf(this_00,&m_ON_PolyCurve_class_rtti);
      if (!bVar1) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
        domain.m_t[1] = in_XMM1_Qa;
        domain.m_t[0] = extraout_XMM0_Qa;
        ON_Curve::SetDomain((ON_Curve *)this_00,domain);
        ON_Object::CopyUserData(this_00,(ON_Object *)this,(ON_UUID)ZEXT816((ulong)0),source_object);
        return (ON_Curve *)this_00;
      }
      (*this_00->_vptr_ON_Object[4])(this_00);
    }
  }
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_PolyCurve::ExplodeSingleSegmentCurve() const

{
  if (Count() != 1)
    return 0;
  ON_Curve* pSeg = SegmentCurve(0)->DuplicateCurve();
  if (!pSeg)
    return 0;
  ON_PolyCurve* pSegPly = ON_PolyCurve::Cast(pSeg);
  if (pSegPly){
    delete pSeg;
    return 0;
  }
  pSeg->SetDomain(Domain());
  pSeg->CopyUserData(*this,ON_nil_uuid,ON_Object::UserDataConflictResolution::source_object);
  return pSeg;
}